

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  byte bVar1;
  ushort uVar2;
  int *piVar3;
  int *piVar4;
  unsigned_short *puVar5;
  int *piVar6;
  uint *puVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uchar *puVar14;
  ulong uVar15;
  uint uVar16;
  uchar *puVar17;
  uchar *puVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  uchar *puVar30;
  size_t sVar31;
  size_t left;
  ulong uVar32;
  size_t left_1;
  uchar *puVar33;
  ulong uVar34;
  bool bVar35;
  uint local_bc;
  
  uVar11 = windowsize >> 3;
  if (0x1fff < windowsize) {
    uVar11 = windowsize;
  }
  uVar21 = 0x40;
  if (0x1fff < windowsize) {
    uVar21 = 0x102;
  }
  uVar25 = 0x3c;
  if (0xffff7fff < windowsize - 0x8001) {
    uVar16 = windowsize - 1;
    uVar25 = 0x5a;
    if ((windowsize & uVar16) == 0) {
      uVar25 = 0x102;
      if (nicematch < 0x102) {
        uVar25 = nicematch;
      }
      if (inpos < insize) {
        puVar14 = in + insize;
        uVar10 = 0;
        uVar9 = 0;
        bVar8 = false;
        uVar24 = 0;
        do {
          uVar12 = getHash(in,insize,inpos);
          uVar23 = 0;
          if (uVar12 == 0) {
            if (uVar24 == 0) {
              puVar18 = in + inpos + 0x102;
              if (puVar14 < in + inpos + 0x102) {
                puVar18 = puVar14;
              }
              puVar17 = in + inpos;
              puVar33 = puVar17;
              for (puVar30 = puVar17; (puVar30 != puVar18 && (puVar33 = puVar30, *puVar30 == '\0'));
                  puVar30 = puVar30 + 1) {
                puVar33 = puVar18;
              }
              uVar23 = (ulong)(uint)((int)puVar33 - (int)puVar17);
            }
            else {
              if ((insize < uVar24 + inpos) || (in[(uVar24 + inpos) - 1] != '\0')) {
                uVar24 = uVar24 - 1;
              }
              uVar23 = (ulong)uVar24;
            }
          }
          uVar24 = (uint)uVar23;
          uVar27 = (uint)inpos & uVar16;
          uVar15 = (ulong)uVar27;
          piVar3 = hash->val;
          piVar3[uVar15] = uVar12;
          piVar4 = hash->head;
          if (piVar4[uVar12] != -1) {
            hash->chain[uVar15] = (unsigned_short)piVar4[uVar12];
          }
          piVar4[uVar12] = uVar27;
          puVar5 = hash->zeros;
          puVar5[uVar15] = (unsigned_short)uVar23;
          piVar6 = hash->headz;
          if (piVar6[uVar23 & 0xffff] != -1) {
            hash->chainz[uVar15] = (unsigned_short)piVar6[uVar23 & 0xffff];
          }
          uVar32 = inpos + 0x102;
          if (insize <= inpos + 0x102) {
            uVar32 = insize;
          }
          piVar6[uVar23 & 0xffff] = uVar27;
          if (uVar11 == 0) {
            local_bc = 0;
            uVar27 = 0;
          }
          else {
            puVar18 = in + inpos;
            uVar27 = 0;
            local_bc = 0;
            uVar19 = 0;
            uVar20 = (ulong)hash->chain[uVar15];
            uVar13 = 1;
            do {
              uVar26 = 0;
              if (uVar15 < uVar20) {
                uVar26 = (ulong)windowsize;
              }
              uVar26 = (uVar15 - uVar20) + uVar26;
              uVar22 = (uint)uVar26;
              if (uVar22 < (uint)uVar19) break;
              if (uVar26 != 0) {
                puVar33 = in + (inpos - (uVar26 & 0xffffffff));
                puVar30 = puVar18;
                if (2 < uVar24) {
                  uVar19 = (ulong)(uint)puVar5[uVar20];
                  if (uVar24 < puVar5[uVar20]) {
                    uVar19 = uVar23;
                  }
                  puVar33 = puVar33 + uVar19;
                  puVar30 = puVar18 + uVar19;
                }
                iVar28 = (int)(in + uVar32);
                for (; puVar30 != in + uVar32; puVar30 = puVar30 + 1) {
                  if (*puVar33 != *puVar30) {
                    iVar28 = (int)puVar30;
                    break;
                  }
                  puVar33 = puVar33 + 1;
                }
                uVar29 = iVar28 - (int)puVar18;
                if ((uVar27 < uVar29) && (uVar27 = uVar29, local_bc = uVar22, uVar25 <= uVar29))
                break;
              }
              uVar2 = hash->chain[uVar20];
              uVar34 = (ulong)uVar2;
              if ((ushort)uVar20 == uVar2) break;
              if ((uVar24 < 3) || (uVar27 <= uVar24)) {
                if (piVar3[uVar2] != uVar12) break;
              }
              else {
                uVar34 = (ulong)hash->chainz[uVar20];
                if (uVar24 != puVar5[uVar34]) break;
              }
              bVar35 = uVar13 != uVar11;
              uVar19 = uVar26;
              uVar20 = uVar34;
              uVar13 = uVar13 + 1;
            } while (bVar35);
          }
          bVar35 = bVar8;
          if (lazymatching == 0) {
LAB_001ce9e2:
            if ((2 < uVar27) && (windowsize < local_bc)) {
              return 0x56;
            }
            bVar8 = bVar35;
            if (((uVar27 < 3) || (uVar27 < minmatch)) || ((uVar27 == 3 && (0x1000 < local_bc)))) {
              bVar1 = in[inpos];
              uVar12 = uivector_resize(out,out->size + 1);
              if (uVar12 == 0) {
                return 0x53;
              }
              out->data[out->size - 1] = (uint)bVar1;
            }
            else {
              uVar15 = 0x1c;
              uVar32 = 1;
              do {
                uVar19 = uVar15 + uVar32 >> 1;
                if (LENGTHBASE[uVar19] < uVar27) {
                  uVar32 = uVar19 + 1;
                }
                else {
                  uVar15 = uVar19 - 1;
                }
              } while (uVar32 <= uVar15);
              if ((0x1c < uVar32) || (uVar27 < LENGTHBASE[uVar32])) {
                uVar32 = uVar32 - 1;
              }
              uVar24 = LENGTHBASE[uVar32 & 0xffffffff];
              uVar15 = 0x1d;
              uVar19 = 1;
              do {
                uVar20 = uVar15 + uVar19 >> 1;
                if (DISTANCEBASE[uVar20] < local_bc) {
                  uVar19 = uVar20 + 1;
                }
                else {
                  uVar15 = uVar20 - 1;
                }
              } while (uVar19 <= uVar15);
              if ((0x1d < uVar19) || (local_bc < DISTANCEBASE[uVar19])) {
                uVar19 = uVar19 - 1;
              }
              uVar12 = DISTANCEBASE[uVar19 & 0xffffffff];
              sVar31 = out->size;
              uVar13 = uivector_resize(out,sVar31 + 4);
              if (uVar13 != 0) {
                puVar7 = out->data;
                puVar7[sVar31] = (int)uVar32 + 0x101;
                puVar7[sVar31 + 1] = uVar27 - uVar24;
                puVar7[sVar31 + 2] = (uint)uVar19;
                puVar7[sVar31 + 3] = local_bc - uVar12;
              }
              piVar3 = hash->head;
              piVar4 = hash->val;
              puVar5 = hash->zeros;
              piVar6 = hash->headz;
              uVar12 = 1;
              sVar31 = inpos;
              do {
                inpos = sVar31 + 1;
                uVar13 = getHash(in,insize,inpos);
                uVar15 = 0;
                if (uVar13 == 0) {
                  if ((int)uVar23 == 0) {
                    puVar18 = in + sVar31 + 0x103;
                    if (puVar14 < in + sVar31 + 0x103) {
                      puVar18 = puVar14;
                    }
                    puVar30 = in + inpos;
                    puVar17 = puVar30;
                    for (puVar33 = puVar30;
                        (puVar33 != puVar18 && (puVar17 = puVar33, *puVar33 == '\0'));
                        puVar33 = puVar33 + 1) {
                      puVar17 = puVar18;
                    }
                    uVar15 = (ulong)(uint)((int)puVar17 - (int)puVar30);
                  }
                  else if ((insize < uVar23 + inpos) ||
                          (uVar15 = uVar23, in[uVar23 + sVar31] != '\0')) {
                    uVar15 = (ulong)((int)uVar23 - 1);
                  }
                }
                uVar24 = (uint)uVar15;
                uVar22 = (uint)inpos & uVar16;
                piVar4[uVar22] = uVar13;
                iVar28 = piVar3[uVar13];
                if (iVar28 != -1) {
                  hash->chain[uVar22] = (unsigned_short)iVar28;
                }
                piVar3[uVar13] = uVar22;
                puVar5[uVar22] = (unsigned_short)uVar15;
                iVar28 = piVar6[uVar15 & 0xffff];
                if (iVar28 != -1) {
                  hash->chainz[uVar22] = (unsigned_short)iVar28;
                }
                piVar6[uVar15 & 0xffff] = uVar22;
                uVar12 = uVar12 + 1;
                uVar23 = uVar15;
                sVar31 = inpos;
              } while (uVar12 != uVar27);
            }
          }
          else {
            if ((bVar8) || (uVar27 < 3)) {
              bVar35 = false;
              if (bVar8) {
                if (inpos == 0) {
                  return 0x51;
                }
                if (uVar9 + 1 < uVar27) {
                  bVar1 = in[inpos - 1];
                  uVar12 = uivector_resize(out,out->size + 1);
                  if (uVar12 == 0) {
                    return 0x53;
                  }
                  out->data[out->size - 1] = (uint)bVar1;
                  bVar35 = false;
                }
                else {
                  piVar4[uVar12] = -1;
                  piVar6[uVar23] = -1;
                  inpos = inpos - 1;
                  local_bc = uVar10;
                  uVar27 = uVar9;
                }
              }
              goto LAB_001ce9e2;
            }
            bVar35 = false;
            if (uVar21 < uVar27 || 0x101 < uVar27) goto LAB_001ce9e2;
            bVar8 = true;
            uVar9 = uVar27;
            uVar10 = local_bc;
          }
          inpos = inpos + 1;
        } while (inpos < insize);
      }
      uVar25 = 0;
    }
  }
  return uVar25;
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
                           const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
                           unsigned minmatch, unsigned nicematch, unsigned lazymatching) {
  size_t pos;
  unsigned i, error = 0;
  /*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
  unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8u;
  unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

  unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
  unsigned numzeros = 0;

  unsigned offset; /*the offset represents the distance in LZ77 terminology*/
  unsigned length;
  unsigned lazy = 0;
  unsigned lazylength = 0, lazyoffset = 0;
  unsigned hashval;
  unsigned current_offset, current_length;
  unsigned prev_offset;
  const unsigned char *lastptr, *foreptr, *backptr;
  unsigned hashpos;

  if(windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
  if((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

  if(nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

  for(pos = inpos; pos < insize; ++pos) {
    size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
    unsigned chainlength = 0;

    hashval = getHash(in, insize, pos);

    if(usezeros && hashval == 0) {
      if(numzeros == 0) numzeros = countZeros(in, insize, pos);
      else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
    } else {
      numzeros = 0;
    }

    updateHashChain(hash, wpos, hashval, numzeros);

    /*the length and offset found for the current position*/
    length = 0;
    offset = 0;

    hashpos = hash->chain[wpos];

    lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

    /*search for the longest string*/
    prev_offset = 0;
    for(;;) {
      if(chainlength++ >= maxchainlength) break;
      current_offset = (unsigned)(hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize);

      if(current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
      prev_offset = current_offset;
      if(current_offset > 0) {
        /*test the next characters*/
        foreptr = &in[pos];
        backptr = &in[pos - current_offset];

        /*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
        if(numzeros >= 3) {
          unsigned skip = hash->zeros[hashpos];
          if(skip > numzeros) skip = numzeros;
          backptr += skip;
          foreptr += skip;
        }

        while(foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/ {
          ++backptr;
          ++foreptr;
        }
        current_length = (unsigned)(foreptr - &in[pos]);

        if(current_length > length) {
          length = current_length; /*the longest length*/
          offset = current_offset; /*the offset that is related to this longest length*/
          /*jump out once a length of max length is found (speed gain). This also jumps
          out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
          if(current_length >= nicematch) break;
        }
      }

      if(hashpos == hash->chain[hashpos]) break;

      if(numzeros >= 3 && length > numzeros) {
        hashpos = hash->chainz[hashpos];
        if(hash->zeros[hashpos] != numzeros) break;
      } else {
        hashpos = hash->chain[hashpos];
        /*outdated hash value, happens if particular value was not encountered in whole last window*/
        if(hash->val[hashpos] != (int)hashval) break;
      }
    }

    if(lazymatching) {
      if(!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH) {
        lazy = 1;
        lazylength = length;
        lazyoffset = offset;
        continue; /*try the next byte*/
      }
      if(lazy) {
        lazy = 0;
        if(pos == 0) ERROR_BREAK(81);
        if(length > lazylength + 1) {
          /*push the previous character as literal*/
          if(!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
        } else {
          length = lazylength;
          offset = lazyoffset;
          hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
          hash->headz[numzeros] = -1; /*idem*/
          --pos;
        }
      }
    }
    if(length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

    /*encode it as length/distance pair or literal value*/
    if(length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/ {
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    } else if(length < minmatch || (length == 3 && offset > 4096)) {
      /*compensate for the fact that longer offsets have more extra bits, a
      length of only 3 may be not worth it then*/
      if(!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
    } else {
      addLengthDistance(out, length, offset);
      for(i = 1; i < length; ++i) {
        ++pos;
        wpos = pos & (windowsize - 1);
        hashval = getHash(in, insize, pos);
        if(usezeros && hashval == 0) {
          if(numzeros == 0) numzeros = countZeros(in, insize, pos);
          else if(pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
        } else {
          numzeros = 0;
        }
        updateHashChain(hash, wpos, hashval, numzeros);
      }
    }
  } /*end of the loop through each character of input*/

  return error;
}